

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

SQNativeClosure * SQNativeClosure::Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)

{
  SQObjectPtr *pSVar1;
  SQNativeClosure *this;
  long lVar2;
  SQInteger n;
  long lVar3;
  
  this = (SQNativeClosure *)sq_vm_malloc(nouters * 0x10 + 0x80);
  SQNativeClosure(this,ss,func);
  this->_outervalues = (SQObjectPtr *)(this + 1);
  this->_noutervalues = nouters;
  lVar2 = 8;
  for (lVar3 = 0; lVar3 < nouters; lVar3 = lVar3 + 1) {
    pSVar1 = this->_outervalues;
    *(undefined4 *)((long)pSVar1 + lVar2 + -8) = 0x1000001;
    *(undefined8 *)((long)&(pSVar1->super_SQObject)._type + lVar2) = 0;
    nouters = this->_noutervalues;
    lVar2 = lVar2 + 0x10;
  }
  return this;
}

Assistant:

static SQNativeClosure *Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)
    {
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(nouters);
        SQNativeClosure *nc=(SQNativeClosure*)SQ_MALLOC(size);
        new (nc) SQNativeClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_noutervalues = nouters;
        _CONSTRUCT_VECTOR(SQObjectPtr,nc->_noutervalues,nc->_outervalues);
        return nc;
    }